

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Model * gvr::loadDepth(char *name,char *spath,bool verbose)

{
  ulong uVar1;
  bool bVar2;
  store_t sVar3;
  int iVar4;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  char *__nptr;
  long lVar8;
  long lVar9;
  ColoredMesh *pCVar10;
  long lVar11;
  double *pdVar12;
  Vector3d *pVVar13;
  float *pfVar14;
  reference pvVar15;
  uint *puVar16;
  byte in_DL;
  char *in_RDI;
  store_t_conflict sVar17;
  double dVar18;
  double dVar19;
  int f [4];
  int j;
  int ii_1;
  int kk_1;
  int valid_1;
  float dmax_1;
  float dmin_1;
  long i_6;
  vector<int,_std::allocator<int>_> *t;
  long k_4;
  long i_5;
  vector<int,_std::allocator<int>_> *l1;
  vector<int,_std::allocator<int>_> *l0;
  vector<int,_std::allocator<int>_> line1;
  vector<int,_std::allocator<int>_> line0;
  int ii;
  int kk;
  int valid;
  float dmax;
  float dmin;
  long i_4;
  long k_3;
  int tn;
  Vector3d P2;
  Vector3d P;
  double d;
  Vector2d p;
  long i_3;
  long k_2;
  Camera *cam;
  long i_2;
  long k_1;
  int ds;
  ImageU8 dsimage;
  ColoredMesh *cmesh;
  ImageU8 *image;
  Mesh *mesh;
  long i_1;
  long k;
  int n;
  ImageFloat *depth;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  float dstep;
  View view;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  ColoredMesh *in_stack_fffffffffffff880;
  Matrix33d *in_stack_fffffffffffff888;
  Model *in_stack_fffffffffffff890;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffff898;
  View *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8d0;
  store_t_conflict in_stack_fffffffffffff8d4;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  long in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff92f;
  undefined8 in_stack_fffffffffffffa00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa40;
  undefined2 uVar20;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa50;
  uint local_388 [4];
  int local_378;
  store_t_conflict local_374;
  store_t_conflict local_370;
  int local_36c;
  int local_368;
  int local_364;
  float local_360;
  float local_35c [2];
  char *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  View *in_stack_fffffffffffffcc0;
  store_t_conflict local_2e4;
  store_t_conflict local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  float local_2d0;
  float local_2cc;
  long local_2c8;
  long local_2c0;
  uint local_2b4;
  SVector<double,_3> local_280;
  SVector<double,_3> local_268;
  double local_250;
  SVector<double,_2> local_248;
  long local_238;
  long local_230;
  SVector<double,_3> local_228;
  Camera *local_210;
  long local_208;
  long local_200;
  int local_184;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_180;
  ColoredMesh *local_148;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_140;
  ColoredMesh *local_138;
  long local_130;
  long local_128;
  uint local_11c;
  Image<float,_gimage::PixelTraits<float>_> *local_118;
  string local_110 [32];
  ulong local_f0;
  allocator local_e1;
  string local_e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  float local_a8;
  View local_98;
  byte local_11;
  char *local_8;
  
  uVar20 = (undefined2)((ulong)in_stack_fffffffffffffa40 >> 0x30);
  local_11 = in_DL & 1;
  local_8 = in_RDI;
  gimage::View::View(in_stack_fffffffffffff8a0);
  lVar9 = stack0xfffffffffffffca8;
  uVar1 = (ulong)stack0xfffffffffffffca8 >> 0x38;
  gimage::loadView(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   SUB81(uVar1,0));
  stack0xfffffffffffffca8 = lVar9;
  local_a8 = gimage::View::getDepthStep(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x151928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,local_8,&local_e1);
  gutil::split(in_stack_fffffffffffffa50,
               (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
               (char)((ushort)uVar20 >> 8),SUB21(uVar20,0));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  for (local_f0 = 1; uVar1 = local_f0,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_c0), uVar1 < sVar6; local_f0 = local_f0 + 1) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c0,local_f0);
    iVar4 = std::__cxx11::string::compare((ulong)pvVar7,0,(char *)0x2);
    if (iVar4 == 0) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_c0,local_f0);
      std::__cxx11::string::substr((ulong)local_110,(ulong)pvVar7);
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar18 = atof(__nptr);
      local_a8 = (float)dVar18;
      std::__cxx11::string::~string(local_110);
    }
  }
  local_118 = gimage::View::getDepthImage(&local_98);
  local_11c = 0;
  local_128 = 0;
  while( true ) {
    lVar9 = local_128;
    lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_118);
    iVar4 = (int)((ulong)in_stack_fffffffffffffa00 >> 0x20);
    if (lVar8 <= lVar9) break;
    for (local_130 = 0; lVar9 = local_130,
        lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118),
        lVar9 < lVar8; local_130 = local_130 + 1) {
      bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                        (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                         (long)in_stack_fffffffffffff888);
      if (bVar2) {
        local_11c = local_11c + 1;
      }
    }
    local_128 = local_128 + 1;
  }
  local_138 = (ColoredMesh *)0x0;
  local_140 = gimage::View::getImage(&local_98);
  lVar9 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_140);
  if ((lVar9 < 1) ||
     (lVar9 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                        (local_140), lVar9 < 1)) {
    pCVar10 = (ColoredMesh *)operator_new(0xc0);
    Mesh::Mesh(&in_stack_fffffffffffff880->super_Mesh);
    local_138 = pCVar10;
    (*(pCVar10->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(pCVar10,(ulong)local_11c,1)
    ;
    goto LAB_00152412;
  }
  pCVar10 = (ColoredMesh *)operator_new(200);
  ColoredMesh::ColoredMesh(in_stack_fffffffffffff880);
  local_148 = pCVar10;
  (*(pCVar10->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(pCVar10,(ulong)local_11c,1);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_stack_fffffffffffff890,
             (long)in_stack_fffffffffffff888,(long)in_stack_fffffffffffff880,
             in_stack_fffffffffffff87c);
  lVar9 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_140);
  lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118);
  lVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118);
  local_184 = (int)((lVar9 + -1 + lVar8) / lVar11);
  if (local_184 < 2) {
    lVar9 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_140);
    lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118);
    if (lVar8 <= lVar9) {
      lVar9 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                        (local_140);
      lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_118);
      if (lVar8 <= lVar9) goto LAB_00151fa8;
    }
    gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118);
    gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_118);
    gimage::resizeImageBilinear<unsigned_char>
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff92f,in_stack_fffffffffffff928),
               in_stack_fffffffffffff920,
               CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               in_stack_fffffffffffff880,
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               in_stack_fffffffffffff890);
    local_140 = &local_180;
  }
  else {
    gimage::downscaleImage<unsigned_char>(in_stack_fffffffffffffa08,iVar4);
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               in_stack_fffffffffffff880,
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               in_stack_fffffffffffff890);
    local_140 = &local_180;
  }
LAB_00151fa8:
  local_11c = 0;
  for (local_200 = 0; lVar9 = local_200,
      lVar8 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                        (local_140), lVar9 < lVar8; local_200 = local_200 + 1) {
    for (local_208 = 0; lVar9 = local_208,
        lVar8 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                          (local_140), lVar9 < lVar8; local_208 = local_208 + 1) {
      bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                        (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                         (long)in_stack_fffffffffffff888);
      if (bVar2) {
        iVar4 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth
                          (local_140);
        uVar5 = local_11c;
        pCVar10 = local_148;
        if (iVar4 == 3) {
          sVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_140,local_208,local_200,0);
          ColoredMesh::setColorComp(pCVar10,uVar5,0,sVar3);
          uVar5 = local_11c;
          pCVar10 = local_148;
          sVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_140,local_208,local_200,1);
          ColoredMesh::setColorComp(pCVar10,uVar5,1,sVar3);
          uVar5 = local_11c;
          pCVar10 = local_148;
          sVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_140,local_208,local_200,2);
          ColoredMesh::setColorComp(pCVar10,uVar5,2,sVar3);
        }
        else {
          sVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_140,local_208,local_200,0);
          ColoredMesh::setColorComp(pCVar10,uVar5,0,sVar3);
          uVar5 = local_11c;
          pCVar10 = local_148;
          sVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_140,local_208,local_200,0);
          ColoredMesh::setColorComp(pCVar10,uVar5,1,sVar3);
          uVar5 = local_11c;
          pCVar10 = local_148;
          sVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_140,local_208,local_200,0);
          ColoredMesh::setColorComp(pCVar10,uVar5,2,sVar3);
        }
        local_11c = local_11c + 1;
      }
    }
  }
  local_138 = local_148;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_stack_fffffffffffff890)
  ;
LAB_00152412:
  local_210 = gimage::View::getCamera(&local_98);
  gmath::Camera::getT(local_210);
  Model::setOrigin((Model *)in_stack_fffffffffffff880,
                   (Vector3d *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  uVar5 = (*local_210->_vptr_Camera[3])();
  if ((uVar5 & 1) != 0) {
    gmath::Camera::getR(local_210);
    gmath::SVector<double,_3>::SVector(&local_228);
    Model::setDefCameraRT
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888,
               (Vector3d *)in_stack_fffffffffffff880);
  }
  local_11c = 0;
  for (local_230 = 0; lVar9 = local_230,
      lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_118), lVar9 < lVar8
      ; local_230 = local_230 + 1) {
    for (local_238 = 0; lVar9 = local_238,
        lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118),
        lVar9 < lVar8; local_238 = local_238 + 1) {
      bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                        (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                         (long)in_stack_fffffffffffff888);
      if (bVar2) {
        gmath::SVector<double,_2>::SVector
                  (&local_248,(double)local_238 + 0.5,(double)local_230 + 0.5);
        sVar17 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                           (local_118,local_238,local_230,0);
        local_250 = (double)sVar17;
        gmath::SVector<double,_3>::SVector(&local_268);
        gmath::SVector<double,_3>::SVector(&local_280);
        (*local_210->_vptr_Camera[8])(local_250,local_210,&local_268,&local_248);
        uVar5 = local_11c;
        pCVar10 = local_138;
        pdVar12 = gmath::SVector<double,_3>::operator[](&local_268,0);
        dVar18 = *pdVar12;
        pVVar13 = gmath::Camera::getT(local_210);
        dVar19 = gmath::SVector<double,_3>::operator[](pVVar13,0);
        PointCloud::setVertexComp((PointCloud *)pCVar10,uVar5,0,(float)(dVar18 - dVar19));
        uVar5 = local_11c;
        pCVar10 = local_138;
        pdVar12 = gmath::SVector<double,_3>::operator[](&local_268,1);
        dVar18 = *pdVar12;
        pVVar13 = gmath::Camera::getT(local_210);
        dVar19 = gmath::SVector<double,_3>::operator[](pVVar13,1);
        PointCloud::setVertexComp((PointCloud *)pCVar10,uVar5,1,(float)(dVar18 - dVar19));
        pCVar10 = local_138;
        uVar5 = local_11c;
        pdVar12 = gmath::SVector<double,_3>::operator[](&local_268,2);
        dVar18 = *pdVar12;
        pVVar13 = gmath::Camera::getT(local_210);
        dVar19 = gmath::SVector<double,_3>::operator[](pVVar13,2);
        PointCloud::setVertexComp((PointCloud *)pCVar10,uVar5,2,(float)(dVar18 - dVar19));
        pdVar12 = gmath::SVector<double,_2>::operator[](&local_248,0);
        *pdVar12 = *pdVar12 + 0.5;
        pdVar12 = gmath::SVector<double,_2>::operator[](&local_248,1);
        *pdVar12 = *pdVar12 + 0.5;
        (*local_210->_vptr_Camera[8])(local_250,local_210,&local_280,&local_248);
        uVar5 = local_11c;
        pCVar10 = local_138;
        gmath::SVector<double,_3>::operator-
                  ((SVector<double,_3> *)in_stack_fffffffffffff898,
                   (SVector<double,_3> *)in_stack_fffffffffffff890);
        dVar18 = gmath::norm<double,3>((SVector<double,_3> *)in_stack_fffffffffffff890);
        PointCloud::setScanSize((PointCloud *)pCVar10,uVar5,(float)(dVar18 + dVar18));
        pdVar12 = gmath::SVector<double,_2>::operator[](&local_248,0);
        *pdVar12 = *pdVar12 + -0.5;
        pdVar12 = gmath::SVector<double,_2>::operator[](&local_248,1);
        *pdVar12 = *pdVar12 - 0.5;
        local_250 = local_250 + 0.5;
        (*local_210->_vptr_Camera[8])(local_250,local_210,&local_280,&local_248);
        uVar5 = local_11c;
        pCVar10 = local_138;
        gmath::SVector<double,_3>::operator-
                  ((SVector<double,_3> *)in_stack_fffffffffffff898,
                   (SVector<double,_3> *)in_stack_fffffffffffff890);
        dVar18 = gmath::norm<double,3>((SVector<double,_3> *)in_stack_fffffffffffff890);
        PointCloud::setScanError((PointCloud *)pCVar10,uVar5,(float)dVar18);
        PointCloud::setScanConf((PointCloud *)local_138,local_11c,1.0);
        PointCloud::setScanPosComp((PointCloud *)local_138,local_11c,0,0.0);
        PointCloud::setScanPosComp((PointCloud *)local_138,local_11c,1,0.0);
        PointCloud::setScanPosComp((PointCloud *)local_138,local_11c,2,0.0);
        local_11c = local_11c + 1;
      }
    }
  }
  local_2b4 = 0;
  for (local_2c0 = 1; lVar9 = local_2c0,
      lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_118), lVar9 < lVar8
      ; local_2c0 = local_2c0 + 1) {
    for (local_2c8 = 1; lVar9 = local_2c8,
        lVar8 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118),
        lVar9 < lVar8; local_2c8 = local_2c8 + 1) {
      local_2cc = std::numeric_limits<float>::max();
      local_2d0 = std::numeric_limits<float>::max();
      local_2d0 = -local_2d0;
      local_2d4 = 0;
      for (local_2d8 = 0; local_2d8 < 2; local_2d8 = local_2d8 + 1) {
        for (local_2dc = 0; local_2dc < 2; local_2dc = local_2dc + 1) {
          bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                            (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                             (long)in_stack_fffffffffffff888);
          if (bVar2) {
            local_2e0 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                                  (local_118,local_2c8 - local_2dc,local_2c0 - local_2d8,0);
            pfVar14 = std::min<float>(&local_2cc,&local_2e0);
            local_2cc = *pfVar14;
            local_2e4 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                                  (local_118,local_2c8 - local_2dc,local_2c0 - local_2d8,0);
            pfVar14 = std::max<float>(&local_2d0,&local_2e4);
            local_2d0 = *pfVar14;
            local_2d4 = local_2d4 + 1;
          }
        }
      }
      if ((2 < local_2d4) && (local_2d0 - local_2cc <= local_a8)) {
        local_2b4 = local_2d4 + -2 + local_2b4;
      }
    }
  }
  (*(local_138->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])
            (local_138,(ulong)local_2b4);
  gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118);
  std::allocator<int>::allocator((allocator<int> *)0x152f02);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a0,
             (size_type)in_stack_fffffffffffff898,(allocator_type *)in_stack_fffffffffffff890);
  std::allocator<int>::~allocator((allocator<int> *)0x152f2e);
  gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118);
  std::allocator<int>::allocator((allocator<int> *)0x152f5a);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8a0,
             (size_type)in_stack_fffffffffffff898,(allocator_type *)in_stack_fffffffffffff890);
  std::allocator<int>::~allocator((allocator<int> *)0x152f86);
  local_11c = 0;
  local_2b4 = 0;
  lVar9 = 0;
  while (lVar8 = lVar9,
        lVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118),
        lVar9 < lVar11) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::at
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    *pvVar15 = -1;
    bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                      (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                       (long)in_stack_fffffffffffff888);
    uVar5 = local_11c;
    if (bVar2) {
      local_11c = local_11c + 1;
      pvVar15 = std::vector<int,_std::allocator<int>_>::at
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      *pvVar15 = uVar5;
    }
    lVar9 = lVar8 + 1;
  }
  lVar9 = 1;
  while (lVar8 = lVar9,
        lVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_118),
        lVar9 < lVar11) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::at
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    *pvVar15 = -1;
    bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                      (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                       (long)in_stack_fffffffffffff888);
    if (bVar2) {
      uVar5 = local_11c;
      local_11c = local_11c + 1;
      pvVar15 = std::vector<int,_std::allocator<int>_>::at
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      *pvVar15 = uVar5;
    }
    for (stack0xfffffffffffffca8 = 1; lVar9 = stack0xfffffffffffffca8,
        lVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_118),
        lVar9 < lVar11; register0x00000000 = stack0xfffffffffffffca8 + 1) {
      local_35c[0] = std::numeric_limits<float>::max();
      local_360 = std::numeric_limits<float>::max();
      local_360 = -local_360;
      local_364 = 0;
      pvVar15 = std::vector<int,_std::allocator<int>_>::at
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      *pvVar15 = -1;
      bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                        (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                         (long)in_stack_fffffffffffff888);
      uVar5 = local_11c;
      if (bVar2) {
        local_11c = local_11c + 1;
        pvVar15 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        *pvVar15 = uVar5;
      }
      for (local_368 = 0; local_368 < 2; local_368 = local_368 + 1) {
        for (local_36c = 0; local_36c < 2; local_36c = local_36c + 1) {
          bVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                            (in_stack_fffffffffffff898,(long)in_stack_fffffffffffff890,
                             (long)in_stack_fffffffffffff888);
          if (bVar2) {
            local_370 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                                  (local_118,stack0xfffffffffffffca8 - local_36c,lVar8 - local_368,0
                                  );
            pfVar14 = std::min<float>(local_35c,&local_370);
            local_35c[0] = *pfVar14;
            in_stack_fffffffffffff8d4 =
                 gimage::Image<float,_gimage::PixelTraits<float>_>::get
                           (local_118,stack0xfffffffffffffca8 - local_36c,lVar8 - local_368,0);
            local_374 = in_stack_fffffffffffff8d4;
            pfVar14 = std::max<float>(&local_360,&local_374);
            local_360 = *pfVar14;
            local_364 = local_364 + 1;
          }
        }
      }
      if ((2 < local_364) && (local_360 - local_35c[0] <= local_a8)) {
        local_378 = 0;
        pvVar15 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        if (-1 < *pvVar15) {
          puVar16 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_fffffffffffff880,
                                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                                      );
          lVar9 = (long)local_378;
          local_378 = local_378 + 1;
          local_388[lVar9] = *puVar16;
        }
        pvVar15 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        if (-1 < *pvVar15) {
          puVar16 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                      ((vector<int,_std::allocator<int>_> *)
                                       in_stack_fffffffffffff880,
                                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                                      );
          lVar9 = (long)local_378;
          local_378 = local_378 + 1;
          local_388[lVar9] = *puVar16;
        }
        pvVar15 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        if (-1 < *pvVar15) {
          in_stack_fffffffffffff898 =
               (Image<float,_gimage::PixelTraits<float>_> *)
               std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                          CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          lVar9 = (long)local_378;
          local_378 = local_378 + 1;
          local_388[lVar9] = in_stack_fffffffffffff898->depth;
        }
        in_stack_fffffffffffff890 =
             (Model *)std::vector<int,_std::allocator<int>_>::at
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        if (-1 < *(int *)&in_stack_fffffffffffff890->_vptr_Model) {
          in_stack_fffffffffffff888 =
               (Matrix33d *)
               std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                          CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          lVar9 = (long)local_378;
          local_378 = local_378 + 1;
          local_388[lVar9] = *(uint *)in_stack_fffffffffffff888->v[0];
        }
        Mesh::setTriangleIndex(&local_138->super_Mesh,local_2b4,0,local_388[0]);
        Mesh::setTriangleIndex(&local_138->super_Mesh,local_2b4,1,local_388[1]);
        Mesh::setTriangleIndex(&local_138->super_Mesh,local_2b4,2,local_388[2]);
        local_2b4 = local_2b4 + 1;
        if (local_378 == 4) {
          Mesh::setTriangleIndex(&local_138->super_Mesh,local_2b4,0,local_388[2]);
          Mesh::setTriangleIndex(&local_138->super_Mesh,local_2b4,1,local_388[3]);
          Mesh::setTriangleIndex(&local_138->super_Mesh,local_2b4,2,local_388[0]);
          local_2b4 = local_2b4 + 1;
        }
      }
    }
    lVar9 = lVar8 + 1;
  }
  Mesh::recalculateNormals((Mesh *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  pCVar10 = local_138;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff890);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff890);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff890);
  gimage::View::~View((View *)pCVar10);
  return (Model *)pCVar10;
}

Assistant:

Model *loadDepth(const char *name, const char *spath, bool verbose)
{
  // load view

  gimage::View view;
  loadView(view, name, spath, verbose);

  // read optional maximum step size parameter

  float dstep=view.getDepthStep();

  std::vector<std::string> list;
  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "s=") == 0)
    {
      dstep=static_cast<float>(atof(list[i].substr(2).c_str()));
    }
  }

  // determine the number of valid points

  const gimage::ImageFloat &depth=view.getDepthImage();

  int n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        n++;
      }
    }
  }

  // create mesh

  Mesh *mesh=0;
  const gimage::ImageU8 *image=&view.getImage();

  if (image->getWidth() > 0 && image->getHeight() > 0)
  {
    ColoredMesh *cmesh=new ColoredMesh();
    cmesh->resizeVertexList(n, true, true);

    // resize image if required

    gimage::ImageU8 dsimage;

    {
      int ds=(image->getWidth()+depth.getWidth()-1)/depth.getWidth();

      if (ds > 1)
      {
        dsimage=gimage::downscaleImage(*image, ds);
        image=&dsimage;
      }
      else if (image->getWidth() < depth.getWidth() || image->getHeight() < depth.getHeight())
      {
        dsimage=gimage::resizeImageBilinear(*image, depth.getWidth(), depth.getHeight());
        image=&dsimage;
      }
    }

    // store colors

    n=0;

    for (long k=0; k<image->getHeight(); k++)
    {
      for (long i=0; i<image->getWidth(); i++)
      {
        if (depth.isValid(i, k))
        {
          if (image->getDepth() == 3)
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 1));
            cmesh->setColorComp(n, 2, image->get(i, k, 2));
          }
          else
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 0));
            cmesh->setColorComp(n, 2, image->get(i, k, 0));
          }

          n++;
        }
      }
    }

    mesh=cmesh;
  }
  else
  {
    mesh=new Mesh();
    mesh->resizeVertexList(n, true, true);
  }

  // reconstruct and store vertices

  const gmath::Camera *cam=view.getCamera();

  mesh->setOrigin(cam->getT());

  if (cam->isPerspective())
  {
    mesh->setDefCameraRT(cam->getR(), gmath::Vector3d());
  }

  n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        gmath::Vector2d p(i+0.5, k+0.5);
        double   d=depth.get(i, k);
        gmath::Vector3d P, P2;

        cam->reconstructPoint(P, p, d);

        mesh->setVertexComp(n, 0, static_cast<float>(P[0]-cam->getT()[0]));
        mesh->setVertexComp(n, 1, static_cast<float>(P[1]-cam->getT()[1]));
        mesh->setVertexComp(n, 2, static_cast<float>(P[2]-cam->getT()[2]));

        p[0]+=0.5;
        p[1]+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanSize(n, static_cast<float>(2*norm(P2-P)));

        p[0]-=0.5;
        p[1]-=0.5;
        d+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanError(n, static_cast<float>(norm(P2-P)));
        mesh->setScanConf(n, 1.0f);

        mesh->setScanPosComp(n, 0, 0.0f);
        mesh->setScanPosComp(n, 1, 0.0f);
        mesh->setScanPosComp(n, 2, 0.0f);

        n++;
      }
    }
  }

  // count number of triangles

  int tn=0;

  for (long k=1; k<depth.getHeight(); k++)
  {
    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        tn+=valid-2;
      }
    }
  }

  mesh->resizeTriangleList(tn);

  // create triangles

  std::vector<int> line0(depth.getWidth());
  std::vector<int> line1(depth.getWidth());
  std::vector<int> *l0=&line0;
  std::vector<int> *l1=&line1;

  n=0;
  tn=0;

  for (long i=0; i<depth.getWidth(); i++)
  {
    l1->at(i)=-1;

    if (depth.isValid(i, 0))
    {
      l1->at(i)=n++;
    }
  }

  for (long k=1; k<depth.getHeight(); k++)
  {
    std::vector<int> *t=l0;
    l0=l1;
    l1=t;

    l1->at(0)=-1;

    if (depth.isValid(0, k))
    {
      l1->at(0)=n++;
    }

    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      l1->at(i)=-1;

      if (depth.isValid(i, k))
      {
        l1->at(i)=n++;
      }

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        int j=0;
        int f[4];

        if (l0->at(i-1) >= 0)
        {
          f[j++]=l0->at(i-1);
        }

        if (l1->at(i-1) >= 0)
        {
          f[j++]=l1->at(i-1);
        }

        if (l1->at(i) >= 0)
        {
          f[j++]=l1->at(i);
        }

        if (l0->at(i) >= 0)
        {
          f[j++]=l0->at(i);
        }

        mesh->setTriangleIndex(tn, 0, f[0]);
        mesh->setTriangleIndex(tn, 1, f[1]);
        mesh->setTriangleIndex(tn, 2, f[2]);
        tn++;

        if (j == 4)
        {
          mesh->setTriangleIndex(tn, 0, f[2]);
          mesh->setTriangleIndex(tn, 1, f[3]);
          mesh->setTriangleIndex(tn, 2, f[0]);
          tn++;
        }
      }
    }
  }

  // compute normals

  mesh->recalculateNormals();

  return mesh;
}